

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O2

void __thiscall cppcms::plugin::scope::load(scope *this,string *name)

{
  _data *p_Var1;
  pointer pbVar2;
  char cVar3;
  iterator iVar4;
  basic_format<char> *this_00;
  locale *loc;
  shared_object *this_01;
  ostream *poVar5;
  __shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2> *this_02;
  cppcms_error *pcVar6;
  size_t i;
  long lVar7;
  string_type *this_03;
  ulong uVar8;
  shared_ptr<booster::shared_object> obj;
  string so_name;
  string_type local_218;
  unique_lock<std::mutex> guard;
  string_type local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string path;
  
  class_data();
  std::unique_lock<std::mutex>::unique_lock(&guard,&class_data::d.lock);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&class_data::d.modules._M_t,name);
  if ((_Rb_tree_header *)iVar4._M_node == &class_data::d.modules._M_t._M_impl.super__Rb_tree_header)
  {
    so_name._M_dataplus._M_p = (pointer)&so_name.field_2;
    so_name._M_string_length = 0;
    so_name.field_2._M_local_buf[0] = '\0';
    p_Var1 = (this->d).ptr_;
    if ((p_Var1->pattern)._M_string_length == 0) {
      booster::shared_object::name((string *)&path);
      this_03 = &path;
      std::__cxx11::string::operator=((string *)&so_name,(string *)this_03);
    }
    else {
      std::__cxx11::string::string((string *)&local_1e8,(string *)&p_Var1->pattern);
      booster::locale::basic_format<char>::basic_format((basic_format<char> *)&path,&local_1e8);
      this_00 = booster::locale::basic_format<char>::operator%((basic_format<char> *)&path,name);
      loc = (locale *)std::locale::classic();
      booster::locale::basic_format<char>::str_abi_cxx11_(&local_218,this_00,loc);
      std::__cxx11::string::operator=((string *)&so_name,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      booster::locale::basic_format<char>::~basic_format((basic_format<char> *)&path);
      this_03 = &local_1e8;
    }
    std::__cxx11::string::~string((string *)this_03);
    this_01 = (shared_object *)operator_new(8);
    booster::shared_object::shared_object(this_01);
    std::__shared_ptr<booster::shared_object,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<booster::shared_object,void>
              ((__shared_ptr<booster::shared_object,(__gnu_cxx::_Lock_policy)2> *)&obj,this_01);
    p_Var1 = (this->d).ptr_;
    if ((p_Var1->paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (p_Var1->paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cVar3 = booster::shared_object::open
                        ((string *)
                         obj.super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(int)&so_name);
      if (cVar3 == '\0') {
        pcVar6 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&path,"Failed to load ",&so_name);
        cppcms_error::cppcms_error(pcVar6,&path);
        __cxa_throw(pcVar6,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    else {
      uVar8 = 0xffffffffffffffff;
      lVar7 = 0;
      do {
        p_Var1 = (this->d).ptr_;
        pbVar2 = (p_Var1->paths).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 1;
        if ((ulong)((long)(p_Var1->paths).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8)
        break;
        std::__cxx11::string::string((string *)&path,(string *)((long)&pbVar2->_M_dataplus + lVar7))
        ;
        if (path._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&path);
        }
        else {
          std::operator+(&local_1c8,&path,"/");
          std::operator+(&local_218,&local_1c8,&so_name);
          std::__cxx11::string::operator=((string *)&path,(string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        cVar3 = booster::shared_object::open
                          ((string *)
                           obj.
                           super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(int)&path);
        lVar7 = lVar7 + 0x20;
        std::__cxx11::string::~string((string *)&path);
      } while (cVar3 == '\0');
      cVar3 = booster::shared_object::is_open();
      if (cVar3 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&path);
        poVar5 = std::operator<<((ostream *)&path,"Failed to load ");
        poVar5 = std::operator<<(poVar5,(string *)&so_name);
        std::operator<<(poVar5," from ");
        lVar7 = 0;
        for (uVar8 = 0; p_Var1 = (this->d).ptr_,
            uVar8 < (ulong)((long)(p_Var1->paths).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(p_Var1->paths).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1
            ) {
          if (uVar8 != 0) {
            std::operator<<((ostream *)&path,", ");
          }
          poVar5 = std::operator<<((ostream *)&path,"`");
          poVar5 = std::operator<<(poVar5,(string *)
                                          ((long)&((((this->d).ptr_)->paths).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus + lVar7));
          std::operator<<(poVar5,"\'");
          lVar7 = lVar7 + 0x20;
        }
        pcVar6 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::stringbuf::str();
        cppcms_error::cppcms_error(pcVar6,&local_218);
        __cxa_throw(pcVar6,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    this_02 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
               ::operator[](&((this->d).ptr_)->objects,name)->
               super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_02,&obj.super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&class_data::d.modules,name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&so_name);
  }
  std::unique_lock<std::mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void scope::load(std::string const &name)
{
	_class_data &cls = class_data();
	booster::unique_lock<booster::mutex> guard(cls.lock);
	if(cls.modules.find(name)!=cls.modules.end())
		return;
	std::string so_name;
	if(d->pattern.empty())
		so_name = booster::shared_object::name(name);
	else
		so_name = (booster::locale::format(d->pattern) % name).str(std::locale::classic());

	booster::shared_ptr<booster::shared_object> obj(new booster::shared_object());
	int dlflags = booster::shared_object::load_lazy |  booster::shared_object::load_global;
	if(d->paths.empty()) {
		if(!obj->open(so_name,dlflags)) 
			throw cppcms_error("Failed to load " + so_name);
	}
	else {
		for(size_t i=0;i<d->paths.size();i++) {
			std::string path  = d->paths[i];
			if(path.empty())
				path = so_name;
			else
				path = path + "/" + so_name;
			if(obj->open(path,dlflags))
				break;
		}
		if(!obj->is_open()) {
			std::ostringstream ss;
			ss << "Failed to load " << so_name << " from ";
			for(size_t i=0;i<d->paths.size();i++) {
				if(i!=0) {
					ss << ", ";
				}
				ss << "`" << d->paths[i] << "'";
			}
			throw cppcms_error(ss.str());
		}
	}
	d->objects[name]=obj;
	cls.modules.insert(name);
}